

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

SshChannel *
ssh1_lportfwd_open(ConnectionLayer *cl,char *hostname,int port,char *description,SocketPeerInfo *pi,
                  Channel *chan)

{
  LogContext *ctx;
  ssh1_channel *c_00;
  char *event;
  PktOut *pPVar1;
  PktOut *pktout;
  ssh1_channel *c;
  PacketProtocolLayer *ppl;
  ssh1_connection_state *s;
  Channel *chan_local;
  SocketPeerInfo *pi_local;
  char *description_local;
  int port_local;
  char *hostname_local;
  ConnectionLayer *cl_local;
  
  c_00 = (ssh1_channel *)safemalloc(1,0x38,0);
  c_00->connlayer = (ssh1_connection_state *)(cl + -0xe);
  ssh1_channel_init(c_00);
  c_00->halfopen = true;
  c_00->chan = chan;
  ctx = cl[5].logctx;
  event = dupprintf("Opening connection to %s:%d for %s",hostname,(ulong)(uint)port,description);
  logevent_and_free(ctx,event);
  pPVar1 = ssh_bpp_new_pktout((BinaryPacketProtocol *)cl[1].vt,0x1d);
  BinarySink_put_uint32(pPVar1->binarysink_,(ulong)c_00->localid);
  BinarySink_put_stringz(pPVar1->binarysink_,hostname);
  BinarySink_put_uint32(pPVar1->binarysink_,(long)port);
  pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar1->qnode);
  return &c_00->sc;
}

Assistant:

static SshChannel *ssh1_lportfwd_open(
    ConnectionLayer *cl, const char *hostname, int port,
    const char *description, const SocketPeerInfo *pi, Channel *chan)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh1_channel *c = snew(struct ssh1_channel);
    PktOut *pktout;

    c->connlayer = s;
    ssh1_channel_init(c);
    c->halfopen = true;
    c->chan = chan;

    ppl_logevent("Opening connection to %s:%d for %s",
                 hostname, port, description);

    pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_PORT_OPEN);
    put_uint32(pktout, c->localid);
    put_stringz(pktout, hostname);
    put_uint32(pktout, port);
    /* originator string would go here, but we didn't specify
     * SSH_PROTOFLAG_HOST_IN_FWD_OPEN */
    pq_push(s->ppl.out_pq, pktout);

    return &c->sc;
}